

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobject.c
# Opt level: O2

int fiobj_iseq____internal_complex__(FIOBJ o,FIOBJ o2)

{
  FIOBJ o_00;
  int iVar1;
  fiobj_object_vtable_s *pfVar2;
  uintptr_t uVar3;
  FIOBJ *in_RCX;
  _func_int_FIOBJ_void_ptr *in_RDX;
  _func_int_FIOBJ_void_ptr *task;
  _func_int_FIOBJ_void_ptr *extraout_RDX;
  int iVar4;
  FIOBJ o2_00;
  fiobj_stack_s queue;
  fiobj_stack_s right;
  fiobj_stack_s left;
  
  left.capa = 0;
  left.arry = (FIOBJ *)0x0;
  left.start = 0;
  left.end = 0;
  right.capa = 0;
  right.arry = (FIOBJ *)0x0;
  right.start = 0;
  right.end = 0;
  queue.capa = 0;
  queue.arry = (FIOBJ *)0x0;
  queue.start = 0;
  queue.end = 0;
  iVar4 = 1;
  while( true ) {
    fiobj_each1(o,(size_t)&left,in_RDX,in_RCX);
    fiobj_each1(o2,(size_t)&right,task,in_RCX);
    while (left.end != left.start) {
      o_00 = left.arry[left.end - 1];
      if (right.end == right.start) {
        o2_00 = 0;
      }
      else {
        o2_00 = right.arry[right.end - 1];
        right.end = right.end - 1;
      }
      left.end = left.end - 1;
      iVar1 = fiobj_iseq_simple(o_00,o2_00);
      if (iVar1 == 0) goto LAB_0013da9a;
      if (((((~(uint)o_00 & 6) != 0) && (o_00 != 0)) && ((o_00 & 1) == 0)) &&
         ((pfVar2 = fiobj_type_vtable(o_00),
          pfVar2->each != (_func_size_t_FIOBJ_size_t__func_int_FIOBJ_void_ptr_ptr_void_ptr *)0x0 &&
          (uVar3 = (*pfVar2->count)(o_00), uVar3 != 0)))) {
        fiobj_stack_push(&queue,o_00);
        fiobj_stack_push(&queue,o2_00);
      }
    }
    if (queue.end == queue.start) {
      o2 = 0;
    }
    else {
      o2 = queue.arry[queue.end - 1];
      queue.end = queue.end - 1;
    }
    if (queue.end == queue.start) {
      o = 0;
      in_RCX = (FIOBJ *)queue.start;
    }
    else {
      o = queue.arry[queue.end - 1];
      in_RCX = queue.arry;
      queue.end = queue.end - 1;
    }
    iVar1 = fiobj_iseq_simple(o,o2);
    if (iVar1 == 0) break;
    in_RDX = extraout_RDX;
    if (o == 0) {
LAB_0013da9c:
      fiobj_stack_free(&left);
      fiobj_stack_free(&right);
      fiobj_stack_free(&queue);
      return iVar4;
    }
  }
LAB_0013da9a:
  iVar4 = 0;
  goto LAB_0013da9c;
}

Assistant:

int fiobj_iseq____internal_complex__(FIOBJ o, FIOBJ o2) {
  // if (FIOBJECT2VTBL(o)->each && FIOBJECT2VTBL(o)->count(o))
  //   return int fiobj_iseq____internal_complex__(const FIOBJ o, const FIOBJ
  //   o2);
  fiobj_stack_s left = FIO_ARY_INIT, right = FIO_ARY_INIT, queue = FIO_ARY_INIT;
  do {
    fiobj_each1(o, 0, fiobj_iseq____internal_complex__task, &left);
    fiobj_each1(o2, 0, fiobj_iseq____internal_complex__task, &right);
    while (fiobj_stack_count(&left)) {
      o = FIOBJ_INVALID;
      o2 = FIOBJ_INVALID;
      fiobj_stack_pop(&left, &o);
      fiobj_stack_pop(&right, &o2);
      if (!fiobj_iseq_simple(o, o2))
        goto unequal;
      if (FIOBJ_IS_ALLOCATED(o) && FIOBJECT2VTBL(o)->each &&
          FIOBJECT2VTBL(o)->count(o)) {
        fiobj_stack_push(&queue, o);
        fiobj_stack_push(&queue, o2);
      }
    }
    o = FIOBJ_INVALID;
    o2 = FIOBJ_INVALID;
    fiobj_stack_pop(&queue, &o2);
    fiobj_stack_pop(&queue, &o);
    if (!fiobj_iseq_simple(o, o2))
      goto unequal;
  } while (o);
  fiobj_stack_free(&left);
  fiobj_stack_free(&right);
  fiobj_stack_free(&queue);
  return 1;
unequal:
  fiobj_stack_free(&left);
  fiobj_stack_free(&right);
  fiobj_stack_free(&queue);
  return 0;
}